

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpr<const_unsigned_long_&,_const_int_&>::streamReconstructedExpression
          (BinaryExpr<const_unsigned_long_&,_const_int_&> *this,ostream *os)

{
  string *in_RSI;
  ostream *in_RDI;
  long in_FS_OFFSET;
  unsigned_long *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  StringRef in_stack_ffffffffffffff88;
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Detail::stringify<unsigned_long>(in_stack_ffffffffffffff68);
  Detail::stringify<int>((int *)in_stack_ffffffffffffff68);
  formatReconstructedExpression(in_RDI,in_RSI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }